

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl.cpp
# Opt level: O0

void __thiscall pg::DTLSolver::search_rec(DTLSolver *this,bitset *R,int player,int depth)

{
  uint uVar1;
  undefined1 __first [8];
  bool bVar2;
  bool bVar3;
  size_t sVar4;
  ostream *poVar5;
  size_t sVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  _label_vertex _Var10;
  byte local_51a;
  byte local_432;
  _label_vertex local_378;
  Game *local_368;
  int local_360;
  _label_vertex local_358;
  uint local_348;
  uint local_344;
  int v_6;
  uint i;
  uint local_32c;
  undefined1 local_328 [4];
  int v_5;
  undefined1 local_318 [16];
  undefined1 local_308 [24];
  undefined1 local_2f0 [4];
  int top_1;
  uint local_2dc;
  undefined1 local_2d8 [4];
  int u_2;
  undefined1 local_2c8 [28];
  int u_1;
  int local_2a8;
  _label_vertex local_2a0;
  size_t local_290;
  size_t v_4;
  uint local_274;
  undefined1 local_270 [4];
  int u;
  undefined1 local_260 [24];
  int v_3;
  int t;
  uint local_234;
  undefined1 local_230 [4];
  int v_2;
  undefined1 local_220 [16];
  undefined1 local_210 [23];
  bool local_1f9;
  int top;
  bool more;
  int local_1f0;
  _label_vertex local_1e8;
  size_t local_1d8;
  size_t v_1;
  Game *pGStack_1c8;
  int result;
  int local_1c0;
  _label_vertex local_1b8;
  size_t local_1a8;
  size_t v;
  bitset Z2;
  bitset Z;
  undefined1 local_150 [8];
  bitset V;
  bitset X;
  int depth_local;
  int player_local;
  bitset *R_local;
  DTLSolver *this_local;
  char local_51;
  size_t *local_50;
  char local_41;
  size_t *local_40;
  char local_31;
  bitset *local_30;
  uintqueue *local_28;
  uintqueue *local_20;
  uint local_14;
  uintqueue *local_10;
  
  sVar4 = Solver::nodecount(&this->super_Solver);
  bitset::bitset((bitset *)&V._allocsize,sVar4);
  sVar4 = Solver::nodecount(&this->super_Solver);
  bitset::bitset((bitset *)local_150,sVar4);
  sVar4 = Solver::nodecount(&this->super_Solver);
  bitset::bitset((bitset *)&Z2._allocsize,sVar4);
  sVar4 = Solver::nodecount(&this->super_Solver);
  bitset::bitset((bitset *)&v,sVar4);
  if (1 < (this->super_Solver).trace) {
    std::operator<<((this->super_Solver).logger,"\x1b[1;38;5;202mcurrent region:\x1b[m");
    for (local_1a8 = bitset::find_first(R); local_1a8 != 0xffffffffffffffff;
        local_1a8 = bitset::find_next(R,local_1a8)) {
      poVar5 = std::operator<<((this->super_Solver).logger," \x1b[1;38;5;15m");
      _Var10 = Solver::label_vertex(&this->super_Solver,(int)local_1a8);
      pGStack_1c8 = _Var10.g;
      local_1c0 = _Var10.v;
      local_1b8.g = pGStack_1c8;
      local_1b8.v = local_1c0;
      poVar5 = operator<<(poVar5,&local_1b8);
      std::operator<<(poVar5,"\x1b[m");
    }
    std::ostream::operator<<((this->super_Solver).logger,std::endl<char,std::char_traits<char>>);
  }
  do {
    while( true ) {
      __first = local_150;
      local_30 = (bitset *)local_150;
      sVar4 = bitset::num_blocks(local_30);
      local_31 = '\0';
      std::fill<unsigned_long*,char>
                ((unsigned_long *)__first,(unsigned_long *)((long)__first + sVar4 * 8),&local_31);
      v_1._4_4_ = best_vertices(this,(bitset *)local_150,R,player);
      if (v_1._4_4_ == 0) {
        bitset::~bitset((bitset *)&v);
        bitset::~bitset((bitset *)&Z2._allocsize);
        bitset::~bitset((bitset *)local_150);
        bitset::~bitset((bitset *)&V._allocsize);
        return;
      }
      if (0 < (this->super_Solver).trace) {
        std::operator<<((this->super_Solver).logger,"\x1b[1;38;5;202mbest vertices:\x1b[m");
        for (local_1d8 = bitset::find_first((bitset *)local_150); local_1d8 != 0xffffffffffffffff;
            local_1d8 = bitset::find_next((bitset *)local_150,local_1d8)) {
          poVar5 = std::operator<<((this->super_Solver).logger," \x1b[1;38;5;15m");
          _Var10 = Solver::label_vertex(&this->super_Solver,(int)local_1d8);
          _top = _Var10.g;
          local_1f0 = _Var10.v;
          local_1e8.g = _top;
          local_1e8.v = local_1f0;
          poVar5 = operator<<(poVar5,&local_1e8);
          std::operator<<(poVar5,"\x1b[m");
        }
        if (v_1._4_4_ == 1) {
          std::operator<<((this->super_Solver).logger," (stable)");
        }
        std::ostream::operator<<((this->super_Solver).logger,std::endl<char,std::char_traits<char>>)
        ;
      }
      if (v_1._4_4_ != 1) break;
      local_1f9 = true;
      while (sVar4 = Z2._allocsize, local_1f9 != false) {
        bitset::operator=((bitset *)&Z2._allocsize,R);
        this->cur_depth = depth;
        local_1f9 = sptl(this,(bitset *)local_150,&this->W,(bitset *)&Z2._allocsize,player);
      }
      local_40 = &Z2._allocsize;
      sVar6 = bitset::num_blocks((bitset *)local_40);
      local_41 = '\0';
      std::fill<unsigned_long*,char>
                ((unsigned_long *)sVar4,(unsigned_long *)(sVar4 + sVar6 * 8),&local_41);
      lVar7 = Solver::nodecount(&this->super_Solver);
      local_210._16_4_ = (undefined4)lVar7;
      while (local_210._16_4_ = local_210._16_4_ - 1, -1 < (int)local_210._16_4_) {
        bitset::operator[]((bitset *)local_210,(size_t)local_150);
        bVar2 = bitset::reference::operator_cast_to_bool((reference *)local_210);
        local_432 = 0;
        if (bVar2) {
          bitset::operator[]((bitset *)local_220,(size_t)&V._allocsize);
          bVar2 = bitset::reference::operator_cast_to_bool((reference *)local_220);
          local_432 = bVar2 ^ 0xff;
        }
        if ((local_432 & 1) != 0) {
          bitset::operator[]((bitset *)local_230,(size_t)&V._allocsize);
          bitset::reference::operator=((reference *)local_230,true);
          this->str[(int)local_210._16_4_] = -1;
          iVar9 = (this->Q).pointer;
          (this->Q).pointer = iVar9 + 1;
          (this->Q).queue[iVar9] = local_210._16_4_;
          while ((this->Q).pointer != 0) {
            iVar9 = (this->Q).pointer + -1;
            (this->Q).pointer = iVar9;
            local_234 = (this->Q).queue[iVar9];
            bitset::operator[]((bitset *)&v_3,(size_t)R);
            bitset::reference::operator=((reference *)&v_3,false);
            uVar1 = local_234;
            iVar9 = Solver::priority(&this->super_Solver,local_210._16_4_);
            attractVertices(this,player,uVar1,R,(bitset *)&V._allocsize,R,iVar9);
            uVar1 = local_234;
            iVar9 = Solver::priority(&this->super_Solver,local_210._16_4_);
            attractTangles(this,player,uVar1,R,(bitset *)&V._allocsize,R,iVar9);
          }
        }
      }
    }
    local_260._20_4_ = 0;
    for (local_260._16_4_ = 0; lVar7 = (long)(int)local_260._16_4_,
        lVar8 = Solver::nodecount(&this->super_Solver), lVar7 < lVar8;
        local_260._16_4_ = local_260._16_4_ + 1) {
      bitset::operator[]((bitset *)local_260,(size_t)R);
      bVar2 = bitset::reference::operator_cast_to_bool((reference *)local_260);
      if (bVar2) {
        iVar9 = Solver::priority(&this->super_Solver,local_260._16_4_);
        if ((int)local_260._20_4_ < iVar9) {
          if ((this->Q).pointer != 0) break;
          local_260._20_4_ = Solver::priority(&this->super_Solver,local_260._16_4_);
        }
        bVar2 = attracts(this,player,local_260._16_4_,(bitset *)&V._allocsize,R);
        if (bVar2) {
          bitset::operator[]((bitset *)local_270,(size_t)&Z2._allocsize);
          bitset::reference::operator=((reference *)local_270,true);
          this->str[(int)local_260._16_4_] = -1;
          iVar9 = (this->Q).pointer;
          (this->Q).pointer = iVar9 + 1;
          (this->Q).queue[iVar9] = local_260._16_4_;
        }
      }
    }
    if ((this->Q).pointer == 0) {
      if (1 < (this->super_Solver).trace) {
        poVar5 = std::operator<<((this->super_Solver).logger,anon_var_dwarf_1e8f87);
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      }
      lVar7 = Solver::nodecount(&this->super_Solver);
      local_308._20_4_ = (undefined4)lVar7;
      while (local_308._20_4_ = local_308._20_4_ - 1, -1 < (int)local_308._20_4_) {
        bitset::operator[]((bitset *)local_308,(size_t)local_150);
        bVar2 = bitset::reference::operator_cast_to_bool((reference *)local_308);
        local_51a = 0;
        if (bVar2) {
          bitset::operator[]((bitset *)local_318,(size_t)&V._allocsize);
          bVar2 = bitset::reference::operator_cast_to_bool((reference *)local_318);
          local_51a = bVar2 ^ 0xff;
        }
        if ((local_51a & 1) != 0) {
          bitset::operator[]((bitset *)local_328,(size_t)&V._allocsize);
          bitset::reference::operator=((reference *)local_328,true);
          this->str[(int)local_308._20_4_] = -1;
          iVar9 = (this->Q).pointer;
          (this->Q).pointer = iVar9 + 1;
          (this->Q).queue[iVar9] = local_308._20_4_;
          while ((this->Q).pointer != 0) {
            iVar9 = (this->Q).pointer + -1;
            (this->Q).pointer = iVar9;
            local_32c = (this->Q).queue[iVar9];
            bitset::operator[]((bitset *)&v_6,(size_t)R);
            bitset::reference::operator=((reference *)&v_6,false);
            uVar1 = local_32c;
            if (2 < (this->super_Solver).trace) {
              iVar9 = (this->Zvec).pointer;
              (this->Zvec).pointer = iVar9 + 1;
              (this->Zvec).queue[iVar9] = local_32c;
            }
            iVar9 = Solver::priority(&this->super_Solver,local_308._20_4_);
            attractVertices(this,player,uVar1,R,(bitset *)&V._allocsize,R,iVar9);
            uVar1 = local_32c;
            iVar9 = Solver::priority(&this->super_Solver,local_308._20_4_);
            attractTangles(this,player,uVar1,R,(bitset *)&V._allocsize,R,iVar9);
          }
          if (1 < (this->super_Solver).trace) {
            std::operator<<((this->super_Solver).logger,"\x1b[1;33mregion\x1b[m ");
            poVar5 = std::operator<<((this->super_Solver).logger,"\x1b[1;36m");
            iVar9 = Solver::priority(&this->super_Solver,local_308._20_4_);
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar9);
            std::operator<<(poVar5,"\x1b[m");
            for (local_344 = 0; local_20 = &this->Zvec, local_344 < (uint)(this->Zvec).pointer;
                local_344 = local_344 + 1) {
              local_10 = &this->Zvec;
              local_14 = local_344;
              local_348 = local_10->queue[local_344];
              poVar5 = std::operator<<((this->super_Solver).logger," \x1b[1;38;5;15m");
              _Var10 = Solver::label_vertex(&this->super_Solver,local_348);
              local_368 = _Var10.g;
              local_360 = _Var10.v;
              local_358.g = local_368;
              local_358.v = local_360;
              poVar5 = operator<<(poVar5,&local_358);
              std::operator<<(poVar5,"\x1b[m");
              if (this->str[(int)local_348] != -1) {
                poVar5 = std::operator<<((this->super_Solver).logger,"->");
                _Var10 = Solver::label_vertex(&this->super_Solver,this->str[(int)local_348]);
                local_378.g = _Var10.g;
                local_378.v = _Var10.v;
                operator<<(poVar5,&local_378);
              }
            }
            std::ostream::operator<<
                      ((this->super_Solver).logger,std::endl<char,std::char_traits<char>>);
            local_28 = &this->Zvec;
            (this->Zvec).pointer = 0;
          }
        }
      }
    }
    else {
      while ((this->Q).pointer != 0) {
        iVar9 = (this->Q).pointer + -1;
        (this->Q).pointer = iVar9;
        local_274 = (this->Q).queue[iVar9];
        bitset::operator[]((bitset *)&v_4,(size_t)R);
        bitset::reference::operator=((reference *)&v_4,false);
        attractVertices(this,player,local_274,R,(bitset *)&Z2._allocsize,R,local_260._20_4_);
        attractTangles(this,player,local_274,R,(bitset *)&Z2._allocsize,R,local_260._20_4_);
      }
      if (1 < (this->super_Solver).trace) {
        poVar5 = std::operator<<((this->super_Solver).logger,anon_var_dwarf_1e8f71);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_260._20_4_);
        std::operator<<(poVar5,":\x1b[m");
        for (local_290 = bitset::find_first((bitset *)&Z2._allocsize);
            local_290 != 0xffffffffffffffff;
            local_290 = bitset::find_next((bitset *)&Z2._allocsize,local_290)) {
          poVar5 = std::operator<<((this->super_Solver).logger," \x1b[1;38;5;15m");
          _Var10 = Solver::label_vertex(&this->super_Solver,(int)local_290);
          register0x00000000 = _Var10.g;
          local_2a8 = _Var10.v;
          local_2a0.g = register0x00000000;
          local_2a0.v = local_2a8;
          poVar5 = operator<<(poVar5,&local_2a0);
          std::operator<<(poVar5,"\x1b[m");
        }
        std::ostream::operator<<((this->super_Solver).logger,std::endl<char,std::char_traits<char>>)
        ;
      }
      lVar7 = Solver::nodecount(&this->super_Solver);
      local_2c8._20_4_ = (undefined4)lVar7;
      while ((local_2c8._20_4_ = local_2c8._20_4_ - 1, -1 < (int)local_2c8._20_4_ &&
             (iVar9 = Solver::priority(&this->super_Solver,local_2c8._20_4_),
             (int)local_260._20_4_ <= iVar9))) {
        bitset::operator[]((bitset *)local_2c8,(size_t)&Z2._allocsize);
        bVar3 = bitset::reference::operator_cast_to_bool((reference *)local_2c8);
        bVar2 = false;
        if (bVar3) {
          iVar9 = Solver::priority(&this->super_Solver,local_2c8._20_4_);
          bVar2 = iVar9 == local_260._20_4_;
        }
        if (bVar2) {
          bitset::operator[]((bitset *)local_2d8,(size_t)&V._allocsize);
          bitset::reference::operator=((reference *)local_2d8,true);
          iVar9 = (this->Q).pointer;
          (this->Q).pointer = iVar9 + 1;
          (this->Q).queue[iVar9] = local_2c8._20_4_;
        }
      }
      while ((this->Q).pointer != 0) {
        iVar9 = (this->Q).pointer + -1;
        (this->Q).pointer = iVar9;
        local_2dc = (this->Q).queue[iVar9];
        bitset::operator[]((bitset *)local_2f0,(size_t)&Z2._allocsize);
        bitset::reference::operator=((reference *)local_2f0,false);
        attractVertices(this,1 - player,local_2dc,(bitset *)&Z2._allocsize,(bitset *)&V._allocsize,
                        (bitset *)&Z2._allocsize,local_260._20_4_);
      }
      bitset::operator|=((bitset *)&V._allocsize,(bitset *)&Z2._allocsize);
      search_rec(this,(bitset *)&Z2._allocsize,player,depth + 1);
      sVar4 = Z2._allocsize;
      local_50 = &Z2._allocsize;
      sVar6 = bitset::num_blocks((bitset *)local_50);
      local_51 = '\0';
      std::fill<unsigned_long*,char>
                ((unsigned_long *)sVar4,(unsigned_long *)(sVar4 + sVar6 * 8),&local_51);
    }
  } while( true );
}

Assistant:

void
DTLSolver::search_rec(bitset &R, const int player, const int depth)
{
    bitset X(nodecount()); // vertices removed from R
    bitset V(nodecount()); // the best vertices each iteration
    bitset Z(nodecount()); // holds various subregions
    bitset Z2(nodecount()); // holds various subregions

    if (trace >= 2) {
        logger << "\033[1;38;5;202mcurrent region:\033[m";
        for (auto v = R.find_first(); v != bitset::npos; v = R.find_next(v)) {
            logger << " \033[1;38;5;15m" << label_vertex(v) << "\033[m";
        }
        logger << std::endl;
    }

    while (true) {
        // Compute the best vertices V
        V.reset();
        int result = best_vertices(V, R, player);
        if (result == 0) return; // done

        if (trace >= 1) {
            logger << "\033[1;38;5;202mbest vertices:\033[m";
            for (auto v = V.find_first(); v != bitset::npos; v = V.find_next(v)) {
                logger << " \033[1;38;5;15m" << label_vertex(v) << "\033[m";
            }
            if (result == 1) logger << " (stable)";
            logger << std::endl;
        }

        // If the best vertices are stable, run SPTL to learn local dominions and add them to X

        if (result == 1) {
            // Run SPTL for a while
            bool more = true;
            while (more) {
                Z = R;
                cur_depth = depth;
                more = sptl(V, W, Z, player);
            }
            Z.reset();

            // Add Dom(V,R) to X
            for (int top=nodecount()-1; top>=0; top--) {
                if (V[top] and !X[top]) {
                    X[top] = true; // add to <X>
                    str[top] = -1;
                    Q.push(top);
                    while (Q.nonempty()) {
                        const int v = Q.pop();
                        R[v] = false;
                        attractVertices(player, v, R, X, R, priority(top));
                        attractTangles(player, v, R, X, R, priority(top));
                    }
                }
            }

            continue;
        }

        // If the best vertices are not stable, first try to attract to X.
        // Find the lowest threshold to attract to X.

        int t = 0; // initial threshold
        for (int v=0; v<nodecount(); v++) {
            if (R[v]) {
                if (priority(v) > t) {
                    if (Q.nonempty()) break;
                    // update threshold
                    t = priority(v);
                }
                if (attracts(player, v, X, R)) {
                    Z[v] = true;
                    str[v] = -1;
                    Q.push(v);
                }
            }
        }

        if (Q.nonempty()) {
            // Apparently, we found the lowest threshold t, they are in Z
            // Now attract with threshold t from R to Z

            while (Q.nonempty()) {
                const int u = Q.pop();
                R[u] = false;
                attractVertices(player, u, R, Z, R, t);
                attractTangles(player, u, R, Z, R, t);
            }

#ifndef NDEBUG
            if (trace >= 2) {
                logger << "X ∪= attracted with threshold " << t << ":\033[m";
                for (auto v = Z.find_first(); v != bitset::npos; v = Z.find_next(v)) {
                    logger << " \033[1;38;5;15m" << label_vertex(v) << "\033[m";
                }
                logger << std::endl;
            }
#endif

            // Now remove the attractor to threshold vertices from Z (by moving them to X)
            for (int u=nodecount()-1; u >= 0; u--) {
                if (priority(u) < t) break; // done
                if (Z[u] and priority(u) == t) {
                    X[u] = true;
                    Q.push(u);
                }
            }

            while (Q.nonempty()) {
                const int u = Q.pop();
                Z[u] = false;
                attractVertices(1-player, u, Z, X, Z, t);
            }

            // And add all vertices in Z also to X
            X |= Z;

            // Recursively Z
            /*if (depth == 0)*/ search_rec(Z, player, depth+1);
            Z.reset();
        } else {
#ifndef NDEBUG
            if (trace >= 2) logger << "X ∪= Dom(V)" << std::endl;
#endif

            // Add Dom(V,R) to X
            for (int top=nodecount()-1; top>=0; top--) {
                if (V[top] and !X[top]) {
                    X[top] = true; // add to <X>
                    str[top] = -1;
                    Q.push(top);
                    while (Q.nonempty()) {
                        const int v = Q.pop();
                        R[v] = false;
#ifndef NDEBUG
                        if (trace >= 3) Zvec.push(v);
#endif
                        attractVertices(player, v, R, X, R, priority(top));
                        attractTangles(player, v, R, X, R, priority(top));
                    }
#ifndef NDEBUG
                    if (trace >= 2) {
                        // report region
                        logger << "\033[1;33mregion\033[m ";
                        logger << "\033[1;36m" << priority(top) << "\033[m";
                        for (unsigned int i=0; i<Zvec.size(); i++) {
                            int v = Zvec[i];
                            logger << " \033[1;38;5;15m" << label_vertex(v) << "\033[m";
                            if (str[v] != -1) logger << "->" << label_vertex(str[v]);
                        }
                        logger << std::endl;
                        Zvec.clear();
                    }
#endif
                }
            }
        }
    }
}